

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O1

int mod2sparse_equal(mod2sparse *m1,mod2sparse *m2)

{
  byte *pbVar1;
  uint uVar2;
  int col;
  int col_00;
  bool bVar3;
  int extraout_EAX;
  int iVar4;
  int extraout_EAX_00;
  int extraout_EAX_01;
  mod2entry *pmVar5;
  void *extraout_RAX;
  void *pvVar6;
  mod2sparse *r;
  mod2sparse *r_00;
  mod2entry *pmVar7;
  void *__s;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  uVar2 = m1->n_rows;
  if ((uVar2 != m2->n_rows) || (m1->n_cols != m2->n_cols)) {
    mod2sparse_equal_cold_1();
    if ((m1->n_rows == m2->n_cols) && (m1->n_cols == m2->n_rows)) {
      if (m2 != m1) {
        mod2sparse_clear(m2);
        iVar4 = extraout_EAX;
        if (0 < m1->n_rows) {
          lVar10 = 0;
          do {
            for (pmVar5 = m1->rows[lVar10].right; -1 < pmVar5->row; pmVar5 = pmVar5->right) {
              mod2sparse_insert(m2,pmVar5->col,(int)lVar10);
            }
            lVar10 = lVar10 + 1;
            iVar4 = m1->n_rows;
          } while (lVar10 < iVar4);
        }
        return iVar4;
      }
    }
    else {
      mod2sparse_transpose_cold_1();
    }
    mod2sparse_transpose_cold_2();
    if ((((m1->n_rows == r->n_rows) && (m1->n_cols == r->n_cols)) && (m2->n_rows == r->n_rows)) &&
       (m2->n_cols == r->n_cols)) {
      if ((r != m1) && (r != m2)) {
        mod2sparse_clear(r);
        iVar4 = extraout_EAX_00;
        if (0 < r->n_rows) {
          lVar10 = 0;
          do {
            pmVar5 = m1->rows[lVar10].right;
            pmVar7 = m2->rows[lVar10].right;
            while ((iVar4 = (int)lVar10, -1 < pmVar5->row && (-1 < pmVar7->row))) {
              col = pmVar5->col;
              col_00 = pmVar7->col;
              if (col == col_00) {
                pmVar5 = pmVar5->right;
LAB_001221eb:
                pmVar7 = pmVar7->right;
              }
              else {
                if (col_00 <= col) {
                  mod2sparse_insert(r,iVar4,col_00);
                  goto LAB_001221eb;
                }
                mod2sparse_insert(r,iVar4,col);
                pmVar5 = pmVar5->right;
              }
            }
            for (; -1 < pmVar5->row; pmVar5 = pmVar5->right) {
              mod2sparse_insert(r,iVar4,pmVar5->col);
            }
            for (; -1 < pmVar7->row; pmVar7 = pmVar7->right) {
              mod2sparse_insert(r,iVar4,pmVar7->col);
            }
            lVar10 = lVar10 + 1;
            iVar4 = r->n_rows;
          } while (lVar10 < iVar4);
        }
        return iVar4;
      }
    }
    else {
      mod2sparse_add_cold_1();
    }
    mod2sparse_add_cold_2();
    if (((m1->n_cols == m2->n_rows) && (m1->n_rows == r_00->n_rows)) && (m2->n_cols == r_00->n_cols)
       ) {
      if ((r_00 != m1) && (r_00 != m2)) {
        mod2sparse_clear(r_00);
        iVar4 = extraout_EAX_01;
        if (0 < m1->n_rows) {
          lVar10 = 0;
          do {
            if ((-1 < (m1->rows[lVar10].right)->row) && (0 < m2->n_cols)) {
              lVar9 = 0;
              do {
                pmVar5 = m1->rows[lVar10].right;
                if (-1 < pmVar5->row) {
                  pmVar7 = m2->cols[lVar9].down;
                  bVar3 = false;
                  do {
                    iVar4 = pmVar7->row;
                    if (iVar4 < 0) break;
                    if (pmVar5->col == iVar4) {
                      bVar3 = (bool)(bVar3 ^ 1);
                      pmVar5 = pmVar5->right;
LAB_001222fe:
                      pmVar7 = pmVar7->down;
                    }
                    else {
                      if (iVar4 <= pmVar5->col) goto LAB_001222fe;
                      pmVar5 = pmVar5->right;
                    }
                  } while (-1 < pmVar5->row);
                  if (bVar3) {
                    mod2sparse_insert(r_00,(int)lVar10,(int)lVar9);
                  }
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < m2->n_cols);
            }
            lVar10 = lVar10 + 1;
            iVar4 = m1->n_rows;
          } while (lVar10 < iVar4);
        }
        return iVar4;
      }
    }
    else {
      mod2sparse_multiply_cold_1();
    }
    mod2sparse_multiply_cold_2();
    uVar2 = m1->n_cols;
    pvVar6 = extraout_RAX;
    if (0 < (long)m1->n_rows) {
      pvVar6 = memset(__s,0,(long)m1->n_rows);
    }
    if (0 < (int)uVar2) {
      pvVar6 = (void *)0x0;
      do {
        if (*(char *)((long)&m2->n_rows + (long)pvVar6) != '\0') {
          for (pmVar5 = m1->cols[(long)pvVar6].down; -1 < pmVar5->row; pmVar5 = pmVar5->down) {
            pbVar1 = (byte *)((long)__s + (ulong)(uint)pmVar5->row);
            *pbVar1 = *pbVar1 ^ 1;
          }
        }
        pvVar6 = (void *)((long)pvVar6 + 1);
      } while (pvVar6 != (void *)(ulong)uVar2);
    }
    return (int)pvVar6;
  }
  if (0 < (int)uVar2) {
    uVar8 = 0;
    do {
      pmVar5 = m2->rows[uVar8].right;
      for (pmVar7 = m1->rows[uVar8].right; -1 < pmVar7->row; pmVar7 = pmVar7->right) {
        if (pmVar5->row < 0) {
          if (-1 < pmVar7->row) {
            return 0;
          }
          break;
        }
        if (pmVar7->col != pmVar5->col) {
          return 0;
        }
        pmVar5 = pmVar5->right;
      }
      if (-1 < pmVar5->row) {
        return 0;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar2);
  }
  return 1;
}

Assistant:

int mod2sparse_equal
( mod2sparse *m1,
  mod2sparse *m2
)
{
  mod2entry *e1, *e2;
  int i;

  if (mod2sparse_rows(m1)!=mod2sparse_rows(m2) 
   || mod2sparse_cols(m1)!=mod2sparse_cols(m2))
  { fprintf(stderr,"mod2sparse_equal: Matrices have different dimensions\n");
    exit(1);
  }
  
  for (i = 0; i<mod2sparse_rows(m1); i++)
  { 
    e1 = mod2sparse_first_in_row(m1,i);
    e2 = mod2sparse_first_in_row(m2,i);

    while (!mod2sparse_at_end(e1) && !mod2sparse_at_end(e2))
    {  
      if (mod2sparse_col(e1)!=mod2sparse_col(e2))
      { return 0;
      }

      e1 = mod2sparse_next_in_row(e1);
      e2 = mod2sparse_next_in_row(e2);
    }

    if (!mod2sparse_at_end(e1) || !mod2sparse_at_end(e2)) 
    { return 0;
    }
  }

  return 1;
}